

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Routines_Disasm.c
# Opt level: O1

void ALIb(PDISASM pMyDisasm)

{
  ulong uVar1;
  Int32 IVar2;
  long MyNumber;
  
  uVar1 = (pMyDisasm->Reserved_).EndOfBlock;
  if ((uVar1 == 0) || ((pMyDisasm->Reserved_).EIP_ + 2 <= uVar1)) {
    (pMyDisasm->Reserved_).ImmediatSize = 8;
    MyNumber = (long)*(char *)((pMyDisasm->Reserved_).EIP_ + 1);
    CopyFormattedNumber(pMyDisasm,(pMyDisasm->Operand2).OpMnemonic,"%.2X",MyNumber);
    (pMyDisasm->Instruction).Immediat = MyNumber;
    strcpy((pMyDisasm->Operand1).OpMnemonic,Registers8Bits[0]);
    (pMyDisasm->Operand1).OpType = 0x20000;
    (pMyDisasm->Operand1).Registers.type = 1;
    (pMyDisasm->Operand1).Registers.gpr = 1;
    (pMyDisasm->Operand1).OpSize = 8;
    (pMyDisasm->Operand2).OpType = 0x8040000;
    (pMyDisasm->Operand2).OpSize = 8;
    (pMyDisasm->Reserved_).EIP_ = (pMyDisasm->Reserved_).EIP_ + 2;
    IVar2 = 2;
    if ((pMyDisasm->Prefix).LockPrefix != '\x01') {
      return;
    }
  }
  else {
    (pMyDisasm->Reserved_).OutOfBlock = 1;
    IVar2 = -2;
  }
  (pMyDisasm->Reserved_).ERROR_OPCODE = IVar2;
  return;
}

Assistant:

void __bea_callspec__ ALIb(PDISASM pMyDisasm)
{
  long MyNumber;
  if (!Security(2, pMyDisasm)) return;
  GV.ImmediatSize = 8;
  MyNumber = *((Int8*) (GV.EIP_+1));
  #ifndef BEA_LIGHT_DISASSEMBLY
    (void) CopyFormattedNumber(pMyDisasm, (char*) &pMyDisasm->Operand2.OpMnemonic,"%.2X",(Int64) MyNumber);
  #endif
  pMyDisasm->Instruction.Immediat = MyNumber;
  #ifndef BEA_LIGHT_DISASSEMBLY
    (void) strcpy((char*) &pMyDisasm->Operand1.OpMnemonic, Registers8Bits[0]);
  #endif
  pMyDisasm->Operand1.OpType = REGISTER_TYPE;pMyDisasm->Operand1.Registers.type = GENERAL_REG;
  pMyDisasm->Operand1.Registers.gpr = REG0;
  pMyDisasm->Operand1.OpSize = 8;
  pMyDisasm->Operand2.OpType = CONSTANT_TYPE+ABSOLUTE_;
  pMyDisasm->Operand2.OpSize = 8;
  GV.EIP_ += 2;
  if (pMyDisasm->Prefix.LockPrefix == InUsePrefix) {
    GV.ERROR_OPCODE = UD_;
  }
}